

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_address.c
# Opt level: O2

LY_ERR lyplg_type_compare_ipv6_address(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  LY_ERR LVar1;
  undefined1 auVar2 [16];
  
  auVar2[0] = -((val1->field_2).boolean == (val2->field_2).boolean);
  auVar2[1] = -((val1->field_2).fixed_mem[1] == (val2->field_2).fixed_mem[1]);
  auVar2[2] = -((val1->field_2).fixed_mem[2] == (val2->field_2).fixed_mem[2]);
  auVar2[3] = -((val1->field_2).fixed_mem[3] == (val2->field_2).fixed_mem[3]);
  auVar2[4] = -((val1->field_2).fixed_mem[4] == (val2->field_2).fixed_mem[4]);
  auVar2[5] = -((val1->field_2).fixed_mem[5] == (val2->field_2).fixed_mem[5]);
  auVar2[6] = -((val1->field_2).fixed_mem[6] == (val2->field_2).fixed_mem[6]);
  auVar2[7] = -((val1->field_2).fixed_mem[7] == (val2->field_2).fixed_mem[7]);
  auVar2[8] = -((val1->field_2).fixed_mem[8] == (val2->field_2).fixed_mem[8]);
  auVar2[9] = -((val1->field_2).fixed_mem[9] == (val2->field_2).fixed_mem[9]);
  auVar2[10] = -((val1->field_2).fixed_mem[10] == (val2->field_2).fixed_mem[10]);
  auVar2[0xb] = -((val1->field_2).fixed_mem[0xb] == (val2->field_2).fixed_mem[0xb]);
  auVar2[0xc] = -((val1->field_2).fixed_mem[0xc] == (val2->field_2).fixed_mem[0xc]);
  auVar2[0xd] = -((val1->field_2).fixed_mem[0xd] == (val2->field_2).fixed_mem[0xd]);
  auVar2[0xe] = -((val1->field_2).fixed_mem[0xe] == (val2->field_2).fixed_mem[0xe]);
  auVar2[0xf] = -((val1->field_2).fixed_mem[0xf] == (val2->field_2).fixed_mem[0xf]);
  if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar2 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar2 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar2 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar2 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar2 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar2 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar2 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar2 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar2 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar2 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar2 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar2 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar2 >> 0x77,0) & 1) << 0xe | (ushort)(auVar2[0xf] >> 7) << 0xf) !=
      0xffff) {
    return LY_ENOT;
  }
  LVar1 = LY_ENOT;
  if (*(long *)((long)&val1->field_2 + 0x10) == *(long *)((long)&val2->field_2 + 0x10)) {
    LVar1 = LY_SUCCESS;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lyplg_type_compare_ipv6_address(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1,
        const struct lyd_value *val2)
{
    struct lyd_value_ipv6_address *v1, *v2;

    LYD_VALUE_GET(val1, v1);
    LYD_VALUE_GET(val2, v2);

    /* zones are NULL or in the dictionary */
    if (memcmp(&v1->addr, &v2->addr, sizeof v1->addr) || (v1->zone != v2->zone)) {
        return LY_ENOT;
    }
    return LY_SUCCESS;
}